

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O3

double __thiscall opengv::math::Sturm::computeLagrangianBound(Sturm *this)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM3 [16];
  vector<double,_std::allocator<double>_> coefficients;
  vector<double,_std::allocator<double>_> local_48;
  double local_30;
  double local_28;
  
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(&local_48,this->_dimension - 1);
  if (this->_dimension != 1) {
    uVar5 = 0;
    do {
      pdVar1 = (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data;
      uVar5 = uVar5 + 1;
      auVar6._0_8_ = pdVar1[(this->_C).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows * uVar5] / *pdVar1;
      auVar6._8_8_ = 0;
      auVar8._8_8_ = 0x7fffffffffffffff;
      auVar8._0_8_ = 0x7fffffffffffffff;
      auVar6 = vandpd_avx512vl(auVar6,auVar8);
      auVar8 = vcvtusi2sd_avx512f(in_XMM3,uVar5);
      local_28 = pow(auVar6._0_8_,1.0 / auVar8._0_8_);
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_48,
                   (iterator)
                   local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_28);
      }
      else {
        *local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_28;
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
    } while (uVar5 < this->_dimension - 1);
  }
  if ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    local_30 = -1.0;
    *local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = -1.0;
    dVar7 = -1.0;
  }
  else {
    auVar8 = ZEXT816(0xbff0000000000000);
    lVar2 = (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar4 = 0;
    lVar3 = 0;
    do {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar4];
      dVar7 = auVar8._0_8_;
      auVar8 = vmaxsd_avx(auVar9,auVar8);
      local_30 = auVar8._0_8_;
      if (dVar7 < local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar4]) {
        lVar3 = lVar4;
      }
      lVar4 = lVar4 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar3] = -1.0;
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      dVar7 = -1.0;
    }
    else {
      auVar8 = ZEXT816(0xbff0000000000000);
      lVar3 = 0;
      do {
        auVar10._8_8_ = 0;
        auVar10._0_8_ =
             local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar3];
        lVar3 = lVar3 + 1;
        auVar8 = vmaxsd_avx(auVar10,auVar8);
        dVar7 = auVar8._0_8_;
      } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
    }
  }
  local_30 = local_30 + dVar7;
  operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return local_30;
}

Assistant:

double
opengv::math::Sturm::computeLagrangianBound()
{
  std::vector<double> coefficients;
  coefficients.reserve(_dimension-1);

  for(size_t i=0; i < _dimension-1; i++)
    coefficients.push_back(pow(fabs(_C(0,i+1)/_C(0,0)),(1.0/(i+1))));

  size_t j = 0;
  double max1 = -1.0;
  for( size_t i = 0; i < coefficients.size(); i++ )
  {
    if( coefficients[i] > max1 )
    {
      j = i;
      max1 = coefficients[i];
    }
  }

  coefficients[j] = -1.0;

  double max2 = -1.0;
  for( size_t i=0; i < coefficients.size(); i++ )
  {
    if( coefficients[i] > max2 )
      max2 = coefficients[i];
  }

  double bound = max1 + max2;
  return bound;
}